

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmaes.cpp
# Opt level: O1

Optimizer * createCMAES(string *configFile)

{
  pointer pcVar1;
  long lVar2;
  Ptr this;
  string local_40;
  
  this._M_t.super___uniq_ptr_impl<Cmaes,_std::default_delete<Cmaes>_>._M_t.
  super__Tuple_impl<0UL,_Cmaes_*,_std::default_delete<Cmaes>_>.super__Head_base<0UL,_Cmaes_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<Cmaes,_std::default_delete<Cmaes>,_true,_true>)operator_new(0x1c0);
  pcVar1 = (configFile->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + configFile->_M_string_length);
  Cmaes::Cmaes((Cmaes *)this._M_t.super___uniq_ptr_impl<Cmaes,_std::default_delete<Cmaes>_>._M_t.
                        super__Tuple_impl<0UL,_Cmaes_*,_std::default_delete<Cmaes>_>.
                        super__Head_base<0UL,_Cmaes_*,_false>._M_head_impl,&local_40);
  if ((__uniq_ptr_impl<Cmaes,_std::default_delete<Cmaes>_>)
      cmaesOptimizer._M_t.super___uniq_ptr_impl<Cmaes,_std::default_delete<Cmaes>_>._M_t.
      super__Tuple_impl<0UL,_Cmaes_*,_std::default_delete<Cmaes>_>.
      super__Head_base<0UL,_Cmaes_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<Cmaes,_std::default_delete<Cmaes>_>)0x0) {
    lVar2 = *(long *)cmaesOptimizer._M_t.super___uniq_ptr_impl<Cmaes,_std::default_delete<Cmaes>_>.
                     _M_t.super__Tuple_impl<0UL,_Cmaes_*,_std::default_delete<Cmaes>_>.
                     super__Head_base<0UL,_Cmaes_*,_false>._M_head_impl;
    cmaesOptimizer._M_t.super___uniq_ptr_impl<Cmaes,_std::default_delete<Cmaes>_>._M_t.
    super__Tuple_impl<0UL,_Cmaes_*,_std::default_delete<Cmaes>_>.
    super__Head_base<0UL,_Cmaes_*,_false>._M_head_impl =
         this._M_t.super___uniq_ptr_impl<Cmaes,_std::default_delete<Cmaes>_>._M_t.
         super__Tuple_impl<0UL,_Cmaes_*,_std::default_delete<Cmaes>_>.
         super__Head_base<0UL,_Cmaes_*,_false>._M_head_impl;
    (**(code **)(lVar2 + 0x28))();
    this._M_t.super___uniq_ptr_impl<Cmaes,_std::default_delete<Cmaes>_>._M_t.
    super__Tuple_impl<0UL,_Cmaes_*,_std::default_delete<Cmaes>_>.
    super__Head_base<0UL,_Cmaes_*,_false>._M_head_impl =
         cmaesOptimizer._M_t.super___uniq_ptr_impl<Cmaes,_std::default_delete<Cmaes>_>._M_t.
         super__Tuple_impl<0UL,_Cmaes_*,_std::default_delete<Cmaes>_>.
         super__Head_base<0UL,_Cmaes_*,_false>._M_head_impl;
  }
  cmaesOptimizer._M_t.super___uniq_ptr_impl<Cmaes,_std::default_delete<Cmaes>_>._M_t.
  super__Tuple_impl<0UL,_Cmaes_*,_std::default_delete<Cmaes>_>.super__Head_base<0UL,_Cmaes_*,_false>
  ._M_head_impl =
       this._M_t.super___uniq_ptr_impl<Cmaes,_std::default_delete<Cmaes>_>._M_t.
       super__Tuple_impl<0UL,_Cmaes_*,_std::default_delete<Cmaes>_>.
       super__Head_base<0UL,_Cmaes_*,_false>._M_head_impl;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return (Optimizer *)
         (__uniq_ptr_impl<Cmaes,_std::default_delete<Cmaes>_>)
         cmaesOptimizer._M_t.super___uniq_ptr_impl<Cmaes,_std::default_delete<Cmaes>_>._M_t.
         super__Tuple_impl<0UL,_Cmaes_*,_std::default_delete<Cmaes>_>.
         super__Head_base<0UL,_Cmaes_*,_false>._M_head_impl;
}

Assistant:

Optimizer* createCMAES(std::string configFile) 
{
    cmaesOptimizer.reset(new Cmaes(configFile));
    return cmaesOptimizer.get();
}